

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

ImGuiTableSettings * ImGui::TableSettingsFindByID(ImGuiID id)

{
  ImGuiID in_EDI;
  ImGuiTableSettings *settings;
  ImGuiContext *g;
  undefined4 in_stack_00000018;
  ImGuiTableSettings *local_20;
  
  local_20 = ImChunkStream<ImGuiTableSettings>::begin(&GImGui->SettingsTables);
  while( true ) {
    if (local_20 == (ImGuiTableSettings *)0x0) {
      return (ImGuiTableSettings *)0x0;
    }
    if (local_20->ID == in_EDI) break;
    local_20 = ImChunkStream<ImGuiTableSettings>::next_chunk
                         ((ImChunkStream<ImGuiTableSettings> *)CONCAT44(id,in_stack_00000018),
                          (ImGuiTableSettings *)g);
  }
  return local_20;
}

Assistant:

ImGuiTableSettings* ImGui::TableSettingsFindByID(ImGuiID id)
{
    // FIXME-OPT: Might want to store a lookup map for this?
    ImGuiContext& g = *GImGui;
    for (ImGuiTableSettings* settings = g.SettingsTables.begin(); settings != NULL; settings = g.SettingsTables.next_chunk(settings))
        if (settings->ID == id)
            return settings;
    return NULL;
}